

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void LodePNGText_cleanup(LodePNGInfo *info)

{
  char **ppcVar1;
  size_t sVar2;
  
  if (info->text_num != 0) {
    sVar2 = 0;
    do {
      ppcVar1 = info->text_keys;
      free(ppcVar1[sVar2]);
      ppcVar1[sVar2] = (char *)0x0;
      ppcVar1 = info->text_strings;
      free(ppcVar1[sVar2]);
      ppcVar1[sVar2] = (char *)0x0;
      sVar2 = sVar2 + 1;
    } while (sVar2 != info->text_num);
  }
  free(info->text_keys);
  free(info->text_strings);
  return;
}

Assistant:

static void LodePNGText_cleanup(LodePNGInfo* info) {
  size_t i;
  for(i = 0; i != info->text_num; ++i) {
    string_cleanup(&info->text_keys[i]);
    string_cleanup(&info->text_strings[i]);
  }
  lodepng_free(info->text_keys);
  lodepng_free(info->text_strings);
}